

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  int value;
  Tokenizer *pTVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  FieldDescriptorProto *field;
  Arena *arena;
  bool bVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string extendee;
  Token extendee_end;
  LocationRecorder location;
  Token extendee_start;
  LocationRecorder extendee_location;
  string local_100;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_e0;
  LocationRecorder *local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  ColumnNumber local_a0;
  LocationRecorder local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  text._M_str = "extend";
  text._M_len = 6;
  local_e0 = messages;
  local_d8 = parent_location;
  bVar3 = Consume(this,text);
  if (bVar3) {
    pTVar1 = this->input_;
    local_80._0_4_ = (pTVar1->current_).type;
    local_78._M_p = (pointer)&local_68;
    pcVar2 = (pTVar1->current_).text._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (pTVar1->current_).text._M_string_length);
    local_50 = (pTVar1->current_).end_column;
    local_58._0_4_ = (pTVar1->current_).line;
    local_58._4_4_ = (pTVar1->current_).column;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    bVar3 = ParseUserDefinedType(this,&local_100);
    if (bVar3) {
      pTVar1 = this->input_;
      local_d0._0_4_ = (pTVar1->previous_).type;
      local_c8._M_p = (pointer)&local_b8;
      pcVar2 = (pTVar1->previous_).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (pTVar1->previous_).text._M_string_length);
      local_a0 = (pTVar1->previous_).end_column;
      local_a8._0_4_ = (pTVar1->previous_).line;
      local_a8._4_4_ = (pTVar1->previous_).column;
      text_00._M_str = "{";
      text_00._M_len = 1;
      bVar3 = ConsumeEndOfDeclaration(this,text_00,extend_location);
      if (bVar3) {
        bVar4 = true;
        do {
          bVar5 = (this->input_->current_).type == TYPE_END;
          bVar3 = !bVar5;
          if (bVar5) {
            RecordError(this,(ErrorMaker)ZEXT816(0x13ac023));
            break;
          }
          value = (extensions->super_RepeatedPtrFieldBase).current_size_;
          LocationRecorder::Init(&local_98,extend_location,extend_location->source_code_info_);
          RepeatedField<int>::Add(&((local_98.location_)->field_0)._impl_.path_,value);
          field = (FieldDescriptorProto *)
                  protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                            (&extensions->super_RepeatedPtrFieldBase,
                             Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
          LocationRecorder::Init(&local_48,&local_98,local_98.source_code_info_);
          RepeatedField<int>::Add(&((local_48.location_)->field_0)._impl_.path_,2);
          LocationRecorder::StartAt(&local_48,(Token *)local_80);
          LocationRecorder::EndAt(&local_48,(Token *)local_d0);
          if (bVar4) {
            LocationRecorder::RecordLegacyLocation(&local_48,(Message *)field,EXTENDEE);
            bVar4 = false;
          }
          LocationRecorder::~LocationRecorder(&local_48);
          *(byte *)&field->field_0 = *(byte *)&field->field_0 | 2;
          arena = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>
                    (&(field->field_0)._impl_.extendee_,&local_100,arena);
          bVar5 = ParseMessageField(this,field,local_e0,local_d8,
                                    location_field_number_for_nested_type,&local_98,containing_file)
          ;
          if (!bVar5) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_98);
          text_01._M_str = "}";
          text_01._M_len = 1;
          bVar5 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
        } while (!bVar5);
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  std::string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type, location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}